

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selfguided_sse4.c
# Opt level: O2

__m256i * cross_sum_fast_even_row(__m256i *__return_storage_ptr__,int32_t *buf,int stride)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  __m256i *palVar3;
  long lVar4;
  undefined1 auVar5 [32];
  
  lVar4 = (long)(int)buf;
  palVar3 = (__m256i *)((long)__return_storage_ptr__ + lVar4 * -4 + -4);
  auVar1 = vpaddd_avx2(*(undefined1 (*) [32])((long)__return_storage_ptr__ + lVar4 * -4 + 4),
                       (undefined1  [32])*palVar3);
  auVar1 = vpaddd_avx2(auVar1,*(undefined1 (*) [32])
                               ((long)__return_storage_ptr__[-1] + lVar4 * 4 + 0x1c));
  auVar1 = vpaddd_avx2(auVar1,*(undefined1 (*) [32])((long)*__return_storage_ptr__ + lVar4 * 4 + 4))
  ;
  auVar2 = vpaddd_avx2(*(undefined1 (*) [32])((long)*__return_storage_ptr__ + lVar4 * 4),
                       *(undefined1 (*) [32])((long)__return_storage_ptr__ + lVar4 * -4));
  auVar5._8_4_ = 5;
  auVar5._0_8_ = 0x500000005;
  auVar5._12_4_ = 5;
  auVar5._16_4_ = 5;
  auVar5._20_4_ = 5;
  auVar5._24_4_ = 5;
  auVar5._28_4_ = 5;
  auVar1 = vpaddd_avx2(auVar1,auVar2);
  auVar1 = vpmulld_avx2(auVar1,auVar5);
  vpaddd_avx2(auVar1,auVar2);
  return palVar3;
}

Assistant:

static inline __m128i cross_sum_fast_even_row(const int32_t *buf, int stride) {
  const __m128i xtl = xx_loadu_128(buf - 1 - stride);
  const __m128i xt = xx_loadu_128(buf - stride);
  const __m128i xtr = xx_loadu_128(buf + 1 - stride);
  const __m128i xbl = xx_loadu_128(buf - 1 + stride);
  const __m128i xb = xx_loadu_128(buf + stride);
  const __m128i xbr = xx_loadu_128(buf + 1 + stride);

  const __m128i fives =
      _mm_add_epi32(xtl, _mm_add_epi32(xtr, _mm_add_epi32(xbr, xbl)));
  const __m128i sixes = _mm_add_epi32(xt, xb);
  const __m128i fives_plus_sixes = _mm_add_epi32(fives, sixes);

  return _mm_add_epi32(
      _mm_add_epi32(_mm_slli_epi32(fives_plus_sixes, 2), fives_plus_sixes),
      sixes);
}